

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead.cc
# Opt level: O0

ostream * pstack::Procman::operator<<(ostream *os,JSON<pstack::Procman::FileEntry,_char> *j)

{
  JObject *pJVar1;
  ostream *poVar2;
  char local_3e [21];
  char local_29;
  JObject local_28;
  JSON<pstack::Procman::FileEntry,_char> *local_18;
  JSON<pstack::Procman::FileEntry,_char> *j_local;
  ostream *os_local;
  
  local_18 = j;
  j_local = (JSON<pstack::Procman::FileEntry,_char> *)os;
  JObject::JObject(&local_28,os);
  local_29 = '\0';
  pJVar1 = JObject::field<char[6],unsigned_long,char>
                     (&local_28,(char (*) [6])"start",&local_18->object->start,&local_29);
  local_3e[1] = 0;
  pJVar1 = JObject::field<char[4],unsigned_long,char>
                     (pJVar1,(char (*) [4])0x1d0f48,&local_18->object->end,local_3e + 1);
  local_3e[0] = '\0';
  pJVar1 = JObject::field<char[8],unsigned_long,char>
                     (pJVar1,(char (*) [8])"fileOff",&local_18->object->fileOff,local_3e);
  poVar2 = JObject::operator_cast_to_ostream_(pJVar1);
  JObject::~JObject(&local_28);
  return poVar2;
}

Assistant:

std::ostream &operator << (std::ostream &os, const JSON<pstack::Procman::FileEntry> &j) {
    return JObject(os)
        .field("start", j.object.start)
        .field("end", j.object.end)
        .field("fileOff", j.object.fileOff);
}